

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_AddItemReferenceToObject(cJSON *object,char *string,cJSON *item)

{
  cJSON *item_00;
  cJSON *item_local;
  char *string_local;
  cJSON *object_local;
  
  item_00 = create_reference(item,&global_hooks);
  cJSON_AddItemToObject(object,string,item_00);
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemReferenceToObject(cJSON *object, const char *string, cJSON *item)
{
    cJSON_AddItemToObject(object, string, create_reference(item, &global_hooks));
}